

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

raw_quasi_adaptive_huffman_data_model * __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::operator=
          (raw_quasi_adaptive_huffman_data_model *this,raw_quasi_adaptive_huffman_data_model *rhs)

{
  decoder_tables *p;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  decoder_tables *pdVar7;
  
  if (this != rhs) {
    uVar1 = rhs->m_max_cycle;
    uVar2 = rhs->m_update_cycle;
    uVar3 = rhs->m_symbols_until_update;
    this->m_total_syms = rhs->m_total_syms;
    this->m_max_cycle = uVar1;
    this->m_update_cycle = uVar2;
    this->m_symbols_until_update = uVar3;
    this->m_total_count = rhs->m_total_count;
    vector<unsigned_short>::operator=(&this->m_sym_freq,&rhs->m_sym_freq);
    vector<unsigned_short>::operator=(&this->m_codes,&rhs->m_codes);
    vector<unsigned_char>::operator=(&this->m_code_sizes,&rhs->m_code_sizes);
    pdVar7 = rhs->m_pDecode_tables;
    p = this->m_pDecode_tables;
    if (pdVar7 == (decoder_tables *)0x0) {
      lzham_delete<lzham::prefix_coding::decoder_tables>(p);
      this->m_pDecode_tables = (decoder_tables *)0x0;
    }
    else if (p == (decoder_tables *)0x0) {
      pdVar7 = lzham_new<lzham::prefix_coding::decoder_tables,lzham::prefix_coding::decoder_tables>
                         ((lzham *)pdVar7,pdVar7);
      this->m_pDecode_tables = pdVar7;
      if (pdVar7 == (decoder_tables *)0x0) {
        clear(this);
        return this;
      }
    }
    else {
      prefix_coding::decoder_tables::operator=(p,pdVar7);
    }
    bVar4 = rhs->m_encoding;
    bVar5 = rhs->m_fast_updating;
    bVar6 = rhs->m_use_polar_codes;
    this->m_decoder_table_bits = rhs->m_decoder_table_bits;
    this->m_encoding = bVar4;
    this->m_fast_updating = bVar5;
    this->m_use_polar_codes = bVar6;
  }
  return this;
}

Assistant:

raw_quasi_adaptive_huffman_data_model& raw_quasi_adaptive_huffman_data_model::operator= (const raw_quasi_adaptive_huffman_data_model& rhs)
   {
      if (this == &rhs)
         return *this;

      m_total_syms = rhs.m_total_syms;

      m_max_cycle = rhs.m_max_cycle;
      m_update_cycle = rhs.m_update_cycle;
      m_symbols_until_update = rhs.m_symbols_until_update;

      m_total_count = rhs.m_total_count;

      m_sym_freq = rhs.m_sym_freq;

      m_codes = rhs.m_codes;
      m_code_sizes = rhs.m_code_sizes;

      if (rhs.m_pDecode_tables)
      {
         if (m_pDecode_tables)
            *m_pDecode_tables = *rhs.m_pDecode_tables;
         else
         {
            m_pDecode_tables = lzham_new<prefix_coding::decoder_tables>(*rhs.m_pDecode_tables);
            if (!m_pDecode_tables)
            {
               clear();
               return *this;
            }
         }
      }
      else
      {
         lzham_delete(m_pDecode_tables);
         m_pDecode_tables = NULL;
      }

      m_decoder_table_bits = rhs.m_decoder_table_bits;
      m_encoding = rhs.m_encoding;
      m_fast_updating = rhs.m_fast_updating;
      m_use_polar_codes = rhs.m_use_polar_codes;

      return *this;
   }